

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O0

TX_SIZE get_sqr_tx_size(int tx_dim)

{
  int tx_dim_local;
  TX_SIZE local_1;
  
  if (tx_dim == 8) {
    local_1 = '\x01';
  }
  else if (tx_dim == 0x10) {
    local_1 = '\x02';
  }
  else if (tx_dim == 0x20) {
    local_1 = '\x03';
  }
  else if ((tx_dim == 0x40) || (tx_dim == 0x80)) {
    local_1 = '\x04';
  }
  else {
    local_1 = '\0';
  }
  return local_1;
}

Assistant:

static inline TX_SIZE get_sqr_tx_size(int tx_dim) {
  switch (tx_dim) {
    case 128:
    case 64: return TX_64X64; break;
    case 32: return TX_32X32; break;
    case 16: return TX_16X16; break;
    case 8: return TX_8X8; break;
    default: return TX_4X4;
  }
}